

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shadow-params.cc
# Opt level: O2

vector<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_> *
cnn::AllocateShadowParameters
          (vector<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>
           *__return_storage_ptr__,Model *m)

{
  pointer ppPVar1;
  Parameters **p;
  pointer ppPVar2;
  
  (__return_storage_ptr__->
  super__Vector_base<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>::reserve
            (__return_storage_ptr__,
             (long)(m->params).
                   super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>._M_impl
                   .super__Vector_impl_data._M_finish -
             (long)(m->params).
                   super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>._M_impl
                   .super__Vector_impl_data._M_start >> 3);
  ppPVar1 = (m->params).super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppPVar2 = (m->params).
                 super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppPVar2 != ppPVar1; ppPVar2 = ppPVar2 + 1) {
    std::vector<cnn::ShadowParameters,std::allocator<cnn::ShadowParameters>>::
    emplace_back<cnn::Parameters&>
              ((vector<cnn::ShadowParameters,std::allocator<cnn::ShadowParameters>> *)
               __return_storage_ptr__,*ppPVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<ShadowParameters> AllocateShadowParameters(const Model& m) {
  vector<ShadowParameters> v;
  v.reserve(m.parameters_list().size());
  for (auto& p : m.parameters_list())
    v.emplace_back(*p);
  return v;
}